

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O0

int OB::Term::width(size_t *width_,size_t fd_)

{
  undefined1 local_28 [2];
  ushort local_26;
  winsize w;
  size_t fd__local;
  size_t *width__local;
  
  if (((fd_ == 0) || (fd_ == 1)) || (fd_ == 2)) {
    w = (winsize)fd_;
    ioctl((int)fd_,0x5413,local_28);
    *width_ = (ulong)local_26;
    width__local._4_4_ = 0;
  }
  else {
    width__local._4_4_ = -1;
  }
  return width__local._4_4_;
}

Assistant:

inline int width(std::size_t& width_, std::size_t fd_ = STDOUT_FILENO)
{
  if (fd_ != STDIN_FILENO && fd_ != STDOUT_FILENO && fd_ != STDERR_FILENO)
  {
    return -1;
  }

  winsize w;
  ioctl(fd_, TIOCGWINSZ, &w);

  width_ = w.ws_col;

  return 0;
}